

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

OsStackTraceGetterInterface * __thiscall
testing::internal::UnitTestImpl::os_stack_trace_getter(UnitTestImpl *this)

{
  OsStackTraceGetterInterface *pOVar1;
  
  if (this->os_stack_trace_getter_ != (OsStackTraceGetterInterface *)0x0) {
    return this->os_stack_trace_getter_;
  }
  pOVar1 = (OsStackTraceGetterInterface *)operator_new(8);
  pOVar1->_vptr_OsStackTraceGetterInterface =
       (_func_int **)&PTR__OsStackTraceGetterInterface_00163470;
  this->os_stack_trace_getter_ = pOVar1;
  return pOVar1;
}

Assistant:

OsStackTraceGetterInterface* UnitTestImpl::os_stack_trace_getter() {
  if (os_stack_trace_getter_ == nullptr) {
#ifdef GTEST_OS_STACK_TRACE_GETTER_
    os_stack_trace_getter_ = new GTEST_OS_STACK_TRACE_GETTER_;
#else
    os_stack_trace_getter_ = new OsStackTraceGetter;
#endif  // GTEST_OS_STACK_TRACE_GETTER_
  }

  return os_stack_trace_getter_;
}